

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stddev.c
# Opt level: O1

TA_RetCode
rangeTestFunction(TA_Integer startIdx,TA_Integer endIdx,TA_Real *outputBuffer,
                 TA_Integer *outputBufferInt,TA_Integer *outBegIdx,TA_Integer *outNbElement,
                 TA_Integer *lookback,void *opaqueData,uint outputNb,uint *isOutputInteger)

{
  TA_RetCode TVar1;
  int iVar2;
  
  *isOutputInteger = 0;
  if (*(int *)(*opaqueData + 0x10) == 0) {
    TVar1 = TA_TRANGE(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                      *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                      outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_TRANGE_Lookback();
  }
  else {
    TVar1 = TA_ATR(startIdx,endIdx,*(double **)((long)opaqueData + 8),
                   *(double **)((long)opaqueData + 0x10),*(double **)((long)opaqueData + 0x18),
                   *(int *)(*opaqueData + 0x14),outBegIdx,outNbElement,outputBuffer);
    iVar2 = TA_ATR_Lookback(*(int *)(*opaqueData + 0x14));
  }
  *lookback = iVar2;
  return TVar1;
}

Assistant:

static TA_RetCode rangeTestFunction( TA_Integer    startIdx,
                                     TA_Integer    endIdx,
                                     TA_Real      *outputBuffer,
                                     TA_Integer   *outputBufferInt,
                                     TA_Integer   *outBegIdx,
                                     TA_Integer   *outNbElement,
                                     TA_Integer   *lookback,
                                     void         *opaqueData,
                                     unsigned int  outputNb,
                                     unsigned int *isOutputInteger )
{
   TA_RetCode retCode;
   TA_RangeTestParam *testParam;

   (void)outputNb;
   (void)outputBufferInt;

   *isOutputInteger = 0;

   testParam = (TA_RangeTestParam *)opaqueData;

   retCode = TA_STDDEV(
                        startIdx,
                        endIdx,
                        testParam->close,
                        testParam->test->optInTimePeriod,
                        testParam->test->optInNbDeviation_1,
                        outBegIdx,
                        outNbElement,
                        outputBuffer );


   *lookback = TA_STDDEV_Lookback( testParam->test->optInTimePeriod,
                       testParam->test->optInNbDeviation_1 );

   return retCode;
}